

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTextIO.cpp
# Opt level: O0

void __thiscall NaTextStreamFile::GetVarNameList(NaTextStreamFile *this,int *nVars,char ***sVars)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  undefined4 *puVar4;
  long *in_RDX;
  int *in_RSI;
  long in_RDI;
  int i;
  int local_1c;
  
  *in_RSI = *(int *)(in_RDI + 0x43c);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *in_RDX = (long)pvVar3;
  if (*in_RDX == 0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 4;
    __cxa_throw(puVar4,&NaException::typeinfo,0);
  }
  local_1c = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x43c) <= local_1c) {
      return;
    }
    pvVar3 = operator_new__(0xd);
    *(void **)(*in_RDX + (long)local_1c * 8) = pvVar3;
    if (*(long *)*in_RDX == 0) break;
    sprintf(*(char **)(*in_RDX + (long)local_1c * 8),"%s_%d","VAR",(ulong)(local_1c + 1));
    local_1c = local_1c + 1;
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 4;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void    NaTextStreamFile::GetVarNameList (int& nVars, char**& sVars)
{
    nVars = nVar;

    sVars = new char*[nVars];
    if(NULL == sVars)
        throw(na_bad_alloc);

    int    i;
    for(i = 0; i < nVar; ++i){
        sVars[i] = new char[10 + strlen(NaVAR_NAME)];
        if(NULL == sVars[0])
            throw(na_bad_alloc);
        sprintf(sVars[i], "%s_%d", NaVAR_NAME, i + 1);
    }
}